

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_param_t * get_scaled_params(vrna_md_t *md)

{
  int iVar1;
  vrna_param_t *pvVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  int (*paiVar6) [8];
  int (*paaiVar7) [5] [5];
  long lVar8;
  int (*paiVar9) [5];
  int (*paaaiVar10) [8] [5] [5];
  int (*paaaaaiVar11) [8] [5] [5] [5] [5];
  int (*paaaaaiVar12) [8] [5] [5] [5] [5];
  int (*paaaaaiVar13) [8] [5] [5] [5] [5];
  int (*paiVar14) [8];
  int (*paaiVar15) [5] [5];
  int (*paiVar16) [5];
  int (*paaaiVar17) [8] [5] [5];
  int (*paaaaiVar18) [8] [5] [5] [5];
  int (*paaaaaiVar19) [8] [5] [5] [5] [5];
  int (*paiVar20) [8];
  int (*paaiVar21) [5] [5];
  int (*paiVar22) [5];
  int (*paaaiVar23) [8] [5] [5];
  int (*paaaaiVar24) [8] [5] [5] [5];
  int (*paaaaaiVar25) [8] [5] [5] [5] [5];
  ulong uVar26;
  int (*paaiVar27) [5] [5];
  vrna_param_t *pvVar28;
  int (*paaaiVar29) [8] [5] [5];
  uint uVar30;
  int (*paaiVar31) [5] [5];
  int (*paaaaiVar32) [8] [5] [5] [5];
  int m;
  int (*paaiVar33) [5] [5];
  int (*paiVar34) [5];
  long lVar35;
  long lVar36;
  int (*paaiVar37) [5] [5];
  int (*paiVar38) [5];
  int m_1;
  int (*paaiVar39) [5] [5];
  int (*paiVar40) [5];
  int (*paaaiVar41) [8] [5] [5];
  int (*paiVar42) [5];
  int (*paaaaiVar43) [8] [5] [5] [5];
  int (*paaaaiVar44) [8] [5] [5] [5];
  int (*paaiVar45) [5] [5];
  int (*paiVar46) [5];
  int (*paaaaaiVar47) [8] [5] [5] [5] [5];
  int (*paaiVar48) [5] [5];
  int (*paiVar49) [5];
  int *piVar50;
  int (*paaiVar51) [5] [5];
  int (*paiVar52) [5];
  int (*paaaaiVar53) [5] [5] [5] [5];
  vrna_param_t *pvVar54;
  long lVar55;
  int (*paaaaiVar56) [5] [5] [5] [5];
  int n;
  ulong uVar57;
  int (*paaaaiVar58) [8] [5] [5] [5];
  long lVar59;
  int (*paaiVar60) [5] [5];
  int (*paiVar61) [5];
  int (*paaaaaiVar62) [8] [5] [5] [5] [5];
  double dVar63;
  int iVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  int (*local_c8) [5];
  
  pvVar2 = (vrna_param_t *)vrna_alloc(0x33ea8);
  memset(pvVar2->param_file,0,0x100);
  pcVar3 = last_parameter_file();
  if (pcVar3 != (char *)0x0) {
    pcVar3 = last_parameter_file();
    strncpy(pvVar2->param_file,pcVar3,0xff);
  }
  memcpy(&pvVar2->model_details,md,0x7e8);
  dVar66 = md->temperature;
  pvVar2->temperature = dVar66;
  dVar67 = (dVar66 + 273.15) / Tmeasure;
  pvVar2->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dVar67);
  pvVar2->lxc = lxc37 * dVar67;
  dVar66 = (double)MultipleCAdH;
  iVar64 = MultipleCAdH - MultipleCA37;
  pvVar2->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dVar67);
  pvVar2->MultipleCA = (int)(dVar66 - (double)iVar64 * dVar67);
  pvVar2->MultipleCB = (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dVar67);
  dVar66 = (double)DuplexInitdH;
  iVar64 = DuplexInitdH - DuplexInit37;
  pvVar2->TerminalAU = (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar67);
  pvVar2->DuplexInit = (int)(dVar66 - (double)iVar64 * dVar67);
  pvVar2->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar67);
  pvVar2->PS_penalty = -0x8a;
  pvVar2->PSM_penalty = 0x3ef;
  pvVar2->PSP_penalty = 0x5dc;
  pvVar2->PB_penalty = 0xf6;
  pvVar2->PUP_penalty = 6;
  pvVar2->PPS_penalty = 0x60;
  pvVar2->e_stP_penalty = 0.89;
  pvVar2->e_intP_penalty = 0.74;
  pvVar2->ap_penalty = 0x155;
  pvVar2->bp_penalty = 0x38;
  pvVar2->cp_penalty = 0xc;
  pvVar2->a_penalty = 0x153;
  pvVar2->b_penalty = 3;
  pvVar2->c_penalty = 2;
  pvVar2->MLclosing = (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar67);
  pvVar2->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar67);
  pvVar2->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar50 = pvVar2->gquad[2] + 3;
  lVar4 = 2;
  do {
    uVar26 = 0;
    do {
      dVar66 = (double)GQuadAlphadH;
      iVar64 = GQuadAlphadH - GQuadAlpha37;
      dVar65 = (double)GQuadBetadH;
      iVar1 = GQuadBetadH - GQuadBeta37;
      uVar57 = uVar26 + 1;
      dVar63 = log((double)(uVar57 & 0xffffffff));
      piVar50[uVar26] =
           (int)(dVar63 * (dVar65 - (double)iVar1 * dVar67)) +
           (int)(dVar66 - (double)iVar64 * dVar67) * ((int)lVar4 + -1);
      uVar26 = uVar57;
    } while (uVar57 != 0x2b);
    lVar4 = lVar4 + 1;
    piVar50 = piVar50 + 0x2e;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    pvVar2->hairpin[lVar4] =
         (int)((double)hairpindH[lVar4] - (double)(hairpindH[lVar4] - hairpin37[lVar4]) * dVar67);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1f);
  lVar4 = 0;
  do {
    *(int *)((long)pvVar2->bulge + lVar4) =
         (int)((double)*(int *)((long)bulgedH + lVar4) -
              (double)(*(int *)((long)bulgedH + lVar4) - *(int *)((long)bulge37 + lVar4)) * dVar67);
    *(int *)((long)pvVar2->internal_loop + lVar4) =
         (int)((double)*(int *)((long)internal_loopdH + lVar4) -
              (double)(*(int *)((long)internal_loopdH + lVar4) -
                      *(int *)((long)internal_loop37 + lVar4)) * dVar67);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x7c);
  if (Tetraloops[0] != '\0') {
    uVar26 = 0;
    uVar30 = 7;
    do {
      pvVar2->Tetraloop_E[uVar26] =
           (int)((double)TetraloopdH[uVar26] -
                (double)(TetraloopdH[uVar26] - Tetraloop37[uVar26]) * dVar67);
      uVar26 = (ulong)((int)uVar26 + 1);
      uVar57 = (ulong)uVar30;
      sVar5 = strlen(Tetraloops);
      uVar30 = uVar30 + 7;
    } while (uVar57 < sVar5);
  }
  if (Triloops[0] != '\0') {
    uVar26 = 0;
    uVar30 = 5;
    do {
      pvVar2->Triloop_E[uVar26] =
           (int)((double)TriloopdH[uVar26] -
                (double)(TriloopdH[uVar26] - Triloop37[uVar26]) * dVar67);
      uVar26 = (ulong)((int)uVar26 + 1);
      uVar57 = (ulong)uVar30;
      sVar5 = strlen(Triloops);
      uVar30 = uVar30 + 5;
    } while (uVar57 < sVar5);
  }
  if (Hexaloops[0] != '\0') {
    uVar26 = 0;
    uVar30 = 9;
    do {
      pvVar2->Hexaloop_E[uVar26] =
           (int)((double)HexaloopdH[uVar26] -
                (double)(HexaloopdH[uVar26] - Hexaloop37[uVar26]) * dVar67);
      uVar26 = (ulong)((int)uVar26 + 1);
      uVar57 = (ulong)uVar30;
      sVar5 = strlen(Hexaloops);
      uVar30 = uVar30 + 9;
    } while (uVar57 < sVar5);
  }
  lVar4 = 0xc767;
  do {
    *(int *)((long)(pvVar2->stack + -1) + 0x1c + lVar4 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar67);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc76f);
  paiVar6 = pvVar2->stack;
  paiVar14 = stackdH;
  paiVar20 = stack37;
  lVar4 = 0;
  do {
    lVar36 = 0;
    do {
      (*paiVar6)[lVar36] =
           (int)((double)(*paiVar14)[lVar36] -
                (double)((*paiVar14)[lVar36] - (*paiVar20)[lVar36]) * dVar67);
      lVar36 = lVar36 + 1;
    } while (lVar36 != 8);
    lVar4 = lVar4 + 1;
    paiVar14 = paiVar14 + 1;
    paiVar20 = paiVar20 + 1;
    paiVar6 = paiVar6 + 1;
  } while (lVar4 != 8);
  paaiVar15 = mismatchIdH;
  paaiVar31 = mismatchI37;
  paaiVar21 = mismatchHdH;
  paaiVar33 = mismatchH37;
  paaiVar37 = mismatch1nIdH;
  paaiVar39 = mismatch1nI37;
  paaiVar7 = mismatch23IdH;
  paaiVar45 = mismatch23I37;
  paaiVar48 = mismatchMdH;
  paaiVar60 = mismatchM37;
  paaiVar51 = mismatchExtdH;
  paaiVar27 = mismatchExt37;
  lVar4 = 0;
  pvVar54 = pvVar2;
  do {
    lVar36 = 0;
    paiVar9 = *paaiVar15;
    paiVar16 = *paaiVar21;
    pvVar28 = pvVar54;
    paiVar22 = *paaiVar31;
    paiVar34 = *paaiVar33;
    paiVar38 = *paaiVar37;
    paiVar40 = *paaiVar39;
    paiVar42 = *paaiVar7;
    paiVar46 = *paaiVar45;
    paiVar49 = *paaiVar48;
    paiVar52 = *paaiVar51;
    paiVar61 = *paaiVar60;
    local_c8 = *paaiVar27;
    do {
      lVar8 = 0;
      do {
        iVar64 = *(int *)((long)*(int (*) [5])*paiVar9 + lVar8);
        *(int *)((long)pvVar28->mismatchI[0][0] + lVar8) =
             (int)((double)iVar64 -
                  (double)(iVar64 - *(int *)((long)*(int (*) [5])*paiVar22 + lVar8)) * dVar67);
        iVar64 = *(int *)((long)*(int (*) [5])*paiVar16 + lVar8);
        *(int *)((long)pvVar28->mismatchH[0][0] + lVar8) =
             (int)((double)iVar64 -
                  (double)(iVar64 - *(int *)((long)*(int (*) [5])*paiVar34 + lVar8)) * dVar67);
        iVar64 = *(int *)((long)*(int (*) [5])*paiVar38 + lVar8);
        *(int *)((long)pvVar28->mismatch1nI[0][0] + lVar8) =
             (int)((double)iVar64 -
                  (double)(iVar64 - *(int *)((long)*(int (*) [5])*paiVar40 + lVar8)) * dVar67);
        iVar64 = *(int *)((long)*(int (*) [5])*paiVar42 + lVar8);
        *(int *)((long)pvVar28->mismatch23I[0][0] + lVar8) =
             (int)((double)iVar64 -
                  (double)(iVar64 - *(int *)((long)*(int (*) [5])*paiVar46 + lVar8)) * dVar67);
        if (md->dangles == 0) {
          *(undefined4 *)((long)pvVar28->mismatchExt[0][0] + lVar8) = 0;
          uVar30 = 0;
          lVar55 = 0x1218;
        }
        else {
          iVar64 = *(int *)((long)*(int (*) [5])*paiVar49 + lVar8);
          uVar30 = (uint)((double)iVar64 -
                         (double)(iVar64 - *(int *)((long)*(int (*) [5])*paiVar61 + lVar8)) * dVar67
                         );
          *(uint *)((long)pvVar28->mismatchM[0][0] + lVar8) = (int)uVar30 >> 0x1f & uVar30;
          iVar64 = *(int *)((long)*(int (*) [5])*paiVar52 + lVar8);
          uVar30 = (uint)((double)iVar64 -
                         (double)(iVar64 - *(int *)((long)*(int (*) [5])*local_c8 + lVar8)) * dVar67
                         );
          uVar30 = (int)uVar30 >> 0x1f & uVar30;
          lVar55 = 0x278;
        }
        *(uint *)((long)(pvVar28->stack + -1) + 0x1c + lVar8 + lVar55) = uVar30;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x14);
      lVar36 = lVar36 + 1;
      pvVar28 = (vrna_param_t *)(pvVar28->stack[0] + 4);
      paiVar9 = paiVar9 + 1;
      paiVar22 = paiVar22 + 1;
      paiVar16 = paiVar16 + 1;
      paiVar34 = paiVar34 + 1;
      paiVar38 = paiVar38 + 1;
      paiVar40 = paiVar40 + 1;
      paiVar42 = paiVar42 + 1;
      paiVar46 = paiVar46 + 1;
      paiVar49 = paiVar49 + 1;
      paiVar61 = paiVar61 + 1;
      paiVar52 = paiVar52 + 1;
      local_c8 = local_c8 + 1;
    } while (lVar36 != 5);
    lVar4 = lVar4 + 1;
    pvVar54 = (vrna_param_t *)(pvVar54->stack + 3);
    paaiVar15 = (int (*) [5] [5])((long)paaiVar15 + 100);
    paaiVar31 = (int (*) [5] [5])((long)paaiVar31 + 100);
    paaiVar21 = (int (*) [5] [5])((long)paaiVar21 + 100);
    paaiVar33 = (int (*) [5] [5])((long)paaiVar33 + 100);
    paaiVar37 = (int (*) [5] [5])((long)paaiVar37 + 100);
    paaiVar39 = (int (*) [5] [5])((long)paaiVar39 + 100);
    paaiVar7 = (int (*) [5] [5])((long)paaiVar7 + 100);
    paaiVar45 = (int (*) [5] [5])((long)paaiVar45 + 100);
    paaiVar48 = (int (*) [5] [5])((long)paaiVar48 + 100);
    paaiVar60 = (int (*) [5] [5])((long)paaiVar60 + 100);
    paaiVar51 = (int (*) [5] [5])((long)paaiVar51 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
  } while (lVar4 != 8);
  paiVar9 = pvVar2->dangle5;
  paiVar16 = dangle5_dH;
  paiVar22 = dangle5_37;
  paiVar34 = dangle3_dH;
  paiVar38 = dangle3_37;
  lVar4 = 0;
  do {
    lVar36 = 0;
    do {
      iVar64 = *(int *)((long)*paiVar16 + lVar36);
      uVar30 = (uint)((double)iVar64 -
                     (double)(iVar64 - *(int *)((long)*paiVar22 + lVar36)) * dVar67);
      *(uint *)((long)*paiVar9 + lVar36) = (int)uVar30 >> 0x1f & uVar30;
      iVar64 = *(int *)((long)*paiVar34 + lVar36);
      uVar30 = (uint)((double)iVar64 -
                     (double)(iVar64 - *(int *)((long)*paiVar38 + lVar36)) * dVar67);
      *(uint *)((long)paiVar9[8] + lVar36) = (int)uVar30 >> 0x1f & uVar30;
      lVar36 = lVar36 + 4;
    } while (lVar36 != 0x14);
    lVar4 = lVar4 + 1;
    paiVar16 = paiVar16 + 1;
    paiVar22 = paiVar22 + 1;
    paiVar9 = paiVar9 + 1;
    paiVar34 = paiVar34 + 1;
    paiVar38 = paiVar38 + 1;
  } while (lVar4 != 8);
  paaaiVar10 = pvVar2->int11;
  paaaiVar17 = int11_dH;
  paaaiVar23 = int11_37;
  lVar4 = 0;
  do {
    lVar36 = 0;
    paaaiVar41 = paaaiVar10;
    paiVar9 = (int (*) [5])paaaiVar23;
    paiVar16 = (int (*) [5])paaaiVar17;
    do {
      lVar8 = 0;
      paaaiVar29 = paaaiVar41;
      paiVar34 = paiVar9;
      paiVar22 = paiVar16;
      do {
        lVar55 = 0;
        do {
          iVar64 = (*(int (*) [5] [5])*paiVar22)[0][lVar55];
          (*paaaiVar29)[0][0][lVar55] =
               (int)((double)iVar64 -
                    (double)(iVar64 - (*(int (*) [5] [5])*paiVar34)[0][lVar55]) * dVar67);
          lVar55 = lVar55 + 1;
        } while (lVar55 != 5);
        lVar8 = lVar8 + 1;
        paiVar22 = paiVar22 + 1;
        paiVar34 = paiVar34 + 1;
        paaaiVar29 = (int (*) [8] [5] [5])((*paaaiVar29)[0] + 1);
      } while (lVar8 != 5);
      lVar36 = lVar36 + 1;
      paiVar16 = paiVar16 + 5;
      paiVar9 = paiVar9 + 5;
      paaaiVar41 = (int (*) [8] [5] [5])(*paaaiVar41 + 1);
    } while (lVar36 != 8);
    lVar4 = lVar4 + 1;
    paaaiVar17 = (int (*) [8] [5] [5])((long)paaaiVar17 + 800);
    paaaiVar23 = (int (*) [8] [5] [5])((long)paaaiVar23 + 800);
    paaaiVar10 = paaaiVar10 + 1;
  } while (lVar4 != 8);
  paaaaiVar43 = pvVar2->int21;
  paaaaiVar18 = int21_dH;
  paaaaiVar24 = int21_37;
  lVar4 = 0;
  do {
    lVar36 = 0;
    paiVar9 = (int (*) [5])paaaaiVar18;
    paiVar16 = (int (*) [5])paaaaiVar24;
    paaaaiVar44 = paaaaiVar43;
    do {
      lVar8 = 0;
      paiVar22 = paiVar16;
      paiVar34 = paiVar9;
      paaaaiVar58 = paaaaiVar44;
      do {
        lVar55 = 0;
        paaaaiVar32 = paaaaiVar58;
        paiVar38 = paiVar34;
        paiVar40 = paiVar22;
        do {
          lVar35 = 0;
          do {
            iVar64 = (*(int (*) [5] [5] [5])*paiVar38)[0][0][lVar35];
            (*paaaaiVar32)[0][0][0][lVar35] =
                 (int)((double)iVar64 -
                      (double)(iVar64 - (*(int (*) [5] [5] [5])*paiVar40)[0][0][lVar35]) * dVar67);
            lVar35 = lVar35 + 1;
          } while (lVar35 != 5);
          lVar55 = lVar55 + 1;
          paiVar38 = paiVar38 + 1;
          paiVar40 = paiVar40 + 1;
          paaaaiVar32 = (int (*) [8] [5] [5] [5])((*paaaaiVar32)[0][0] + 1);
        } while (lVar55 != 5);
        lVar8 = lVar8 + 1;
        paiVar34 = (int (*) [5])(*paiVar34 + 0x19);
        paiVar22 = (int (*) [5])(*paiVar22 + 0x19);
        paaaaiVar58 = (int (*) [8] [5] [5] [5])((*paaaaiVar58)[0] + 1);
      } while (lVar8 != 5);
      lVar36 = lVar36 + 1;
      paiVar9 = paiVar9 + 0x19;
      paiVar16 = paiVar16 + 0x19;
      paaaaiVar44 = (int (*) [8] [5] [5] [5])(*paaaaiVar44 + 1);
    } while (lVar36 != 8);
    lVar4 = lVar4 + 1;
    paaaaiVar18 = (int (*) [8] [5] [5] [5])((long)paaaaiVar18 + 4000);
    paaaaiVar24 = (int (*) [8] [5] [5] [5])((long)paaaaiVar24 + 4000);
    paaaaiVar43 = paaaaiVar43 + 1;
  } while (lVar4 != 8);
  paaaaaiVar11 = pvVar2->int22;
  paaaaaiVar19 = int22_dH;
  paaaaaiVar25 = int22_37;
  lVar4 = 0;
  do {
    lVar36 = 0;
    paaaaaiVar12 = paaaaaiVar11;
    paiVar9 = (int (*) [5])paaaaaiVar25;
    paiVar16 = (int (*) [5])paaaaaiVar19;
    do {
      lVar8 = 0;
      paaaaaiVar13 = paaaaaiVar12;
      paiVar22 = paiVar16;
      paiVar34 = paiVar9;
      do {
        lVar55 = 0;
        paiVar38 = paiVar22;
        paaaaaiVar47 = paaaaaiVar13;
        paiVar40 = paiVar34;
        do {
          lVar35 = 0;
          paaaaiVar53 = (int (*) [5] [5] [5] [5])paiVar40;
          paaaaiVar56 = (int (*) [5] [5] [5] [5])paiVar38;
          paaaaaiVar62 = paaaaaiVar47;
          do {
            lVar59 = 0;
            do {
              iVar64 = (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar56)[0][0][0][lVar59];
              (*paaaaaiVar62)[0][0][0][0][lVar59] =
                   (int)((double)iVar64 -
                        (double)(iVar64 - (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar53)[0]
                                          [0][0][lVar59]) * dVar67);
              lVar59 = lVar59 + 1;
            } while (lVar59 != 5);
            lVar35 = lVar35 + 1;
            paaaaiVar56 = (int (*) [5] [5] [5] [5])((long)paaaaiVar56 + 0x14);
            paaaaiVar53 = (int (*) [5] [5] [5] [5])((long)paaaaiVar53 + 0x14);
            paaaaaiVar62 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar62)[0][0][0] + 1);
          } while (lVar35 != 5);
          lVar55 = lVar55 + 1;
          paiVar38 = (int (*) [5])(*paiVar38 + 0x19);
          paiVar40 = (int (*) [5])(*paiVar40 + 0x19);
          paaaaaiVar47 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar47)[0][0] + 1);
        } while (lVar55 != 5);
        lVar8 = lVar8 + 1;
        paiVar22 = paiVar22 + 0x19;
        paiVar34 = paiVar34 + 0x19;
        paaaaaiVar13 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar13)[0] + 1);
      } while (lVar8 != 5);
      lVar36 = lVar36 + 1;
      paiVar16 = paiVar16 + 0x7d;
      paiVar9 = paiVar9 + 0x7d;
      paaaaaiVar12 = (int (*) [8] [5] [5] [5] [5])(*paaaaaiVar12 + 1);
    } while (lVar36 != 8);
    lVar4 = lVar4 + 1;
    paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar19 + 20000);
    paaaaaiVar25 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar25 + 20000);
    paaaaaiVar11 = paaaaaiVar11 + 1;
  } while (lVar4 != 8);
  strncpy(pvVar2->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar2->Triloops,Triloops,0xf1);
  strncpy(pvVar2->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar2->id = id;
  return pvVar2;
}

Assistant:

PRIVATE vrna_param_t *
get_scaled_params(vrna_md_t *md)
{
  unsigned int  i, j, k, l;
  double        tempf;
  vrna_param_t  *params;

  params = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));

  memset(params->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(params->param_file, last_parameter_file(), 255);

  params->model_details = *md;  /* copy over the model details */
  params->temperature   = md->temperature;
  tempf                 = ((params->temperature + K0) / Tmeasure);

  params->ninio[2]              = RESCALE_dG(ninio37, niniodH, tempf);
  params->lxc                   = lxc37 * tempf;
  params->TripleC               = RESCALE_dG(TripleC37, TripleCdH, tempf);
  params->MultipleCA            = RESCALE_dG(MultipleCA37, MultipleCAdH, tempf);
  params->MultipleCB            = RESCALE_dG(MultipleCB37, MultipleCBdH, tempf);
  params->TerminalAU            = RESCALE_dG(TerminalAU37, TerminalAUdH, tempf);
  params->DuplexInit            = RESCALE_dG(DuplexInit37, DuplexInitdH, tempf);
  params->MLbase                = RESCALE_dG(ML_BASE37, ML_BASEdH, tempf);
  // Pseudoknot -- added by Mateo 2/14/23
  params->PS_penalty            = -138;
  params->PSM_penalty           = 1007; 
  params->PSP_penalty           = 1500; 
  params->PB_penalty            = 246; 
  params->PUP_penalty           = 6; 
  params->PPS_penalty           = 96; 
  params->e_stP_penalty         = .89; 
  params->e_intP_penalty        = .74;
  params->ap_penalty            = 341;
  params->bp_penalty            = 56;
  params->cp_penalty            = 12;
  params->a_penalty            = 339; // Fix later
  params->b_penalty            = 3;
  params->c_penalty            = 2;
  //
  params->MLclosing             = RESCALE_dG(ML_closing37, ML_closingdH, tempf);
  params->gquadLayerMismatch    = RESCALE_dG(GQuadLayerMismatch37, GQuadLayerMismatchH, tempf);
  params->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, tempf);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, tempf);
      params->gquad[i][j] = (int)GQuadAlpha_T * (i - 1) + (int)(((double)GQuadBeta_T) * log(j - 2));
    }

  for (i = 0; i < 31; i++)
    params->hairpin[i] = RESCALE_dG(hairpin37[i], hairpindH[i], tempf);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    params->bulge[i]          = RESCALE_dG(bulge37[i], bulgedH[i], tempf);
    params->internal_loop[i]  = RESCALE_dG(internal_loop37[i], internal_loopdH[i], tempf);
  }

  for (; i <= MAXLOOP; i++) {
    params->bulge[i] = params->bulge[30] +
                       (int)(params->lxc * log((double)(i) / 30.));
    params->internal_loop[i] = params->internal_loop[30] +
                               (int)(params->lxc * log((double)(i) / 30.));
  }

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    params->Tetraloop_E[i] = RESCALE_dG(Tetraloop37[i], TetraloopdH[i], tempf);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    params->Triloop_E[i] = RESCALE_dG(Triloop37[i], TriloopdH[i], tempf);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    params->Hexaloop_E[i] = RESCALE_dG(Hexaloop37[i], HexaloopdH[i], tempf);

  for (i = 0; i <= NBPAIRS; i++)
    params->MLintern[i] = RESCALE_dG(ML_intern37, ML_interndH, tempf);

  /* stacks    G(T) = H - [H - G(T0)]*T/T0 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      params->stack[i][j] = RESCALE_dG(stack37[i][j],
                                       stackdH[i][j],
                                       tempf);

  /* mismatches */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        int mm;
        params->mismatchI[i][j][k] = RESCALE_dG(mismatchI37[i][j][k],
                                                mismatchIdH[i][j][k],
                                                tempf);
        params->mismatchH[i][j][k] = RESCALE_dG(mismatchH37[i][j][k],
                                                mismatchHdH[i][j][k],
                                                tempf);
        params->mismatch1nI[i][j][k] = RESCALE_dG(mismatch1nI37[i][j][k],
                                                  mismatch1nIdH[i][j][k],
                                                  tempf);
        params->mismatch23I[i][j][k] = RESCALE_dG(mismatch23I37[i][j][k],
                                                  mismatch23IdH[i][j][k],
                                                  tempf);
        if (md->dangles) {
          mm = RESCALE_dG(mismatchM37[i][j][k],
                          mismatchMdH[i][j][k],
                          tempf);
          params->mismatchM[i][j][k]  = (mm > 0) ? 0 : mm;
          mm                          = RESCALE_dG(mismatchExt37[i][j][k],
                                                   mismatchExtdH[i][j][k],
                                                   tempf);
          params->mismatchExt[i][j][k] = (mm > 0) ? 0 : mm;
        } else {
          params->mismatchM[i][j][k] = params->mismatchExt[i][j][k] = 0;
        }
      }

  /* dangles */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++) {
      int dd;
      dd = RESCALE_dG(dangle5_37[i][j],
                      dangle5_dH[i][j],
                      tempf);
      params->dangle5[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
      dd                    = RESCALE_dG(dangle3_37[i][j],
                                         dangle3_dH[i][j],
                                         tempf);
      params->dangle3[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
    }

  /* interior 1x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          params->int11[i][j][k][l] = RESCALE_dG(int11_37[i][j][k][l],
                                                 int11_dH[i][j][k][l],
                                                 tempf);

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++)
            params->int21[i][j][k][l][m] = RESCALE_dG(int21_37[i][j][k][l][m],
                                                      int21_dH[i][j][k][l][m],
                                                      tempf);
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              params->int22[i][j][k][l][m][n] = RESCALE_dG(int22_37[i][j][k][l][m][n],
                                                           int22_dH[i][j][k][l][m][n],
                                                           tempf);
        }

  strncpy(params->Tetraloops, Tetraloops, 281);
  strncpy(params->Triloops, Triloops, 241);
  strncpy(params->Hexaloops, Hexaloops, 361);

  params->id = ++id;
  return params;
}